

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dmidtex.cpp
# Opt level: O2

bool P_Scroll3dMidtex(sector_t_conflict *sector,int crush,double move,bool ceiling)

{
  uint uVar1;
  extsector_t *peVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  uint i;
  ulong uVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  byte bVar8;
  uint i_1;
  
  peVar2 = sector->e;
  uVar7 = (ulong)(uint)((int)CONCAT71(in_register_00000011,ceiling) << 5);
  uVar1 = *(uint *)((long)&(peVar2->Midtex).Floor.AttachedLines.Count + uVar7);
  uVar7 = uVar7 | 0x10;
  for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    lVar3 = *(long *)(*(long *)((long)&(peVar2->Midtex).Floor.AttachedSectors.Array + uVar7) +
                     uVar6 * 8);
    lVar4 = *(long *)(lVar3 + 0x48);
    *(double *)(lVar4 + 0x48) = *(double *)(lVar4 + 0x48) + move;
    lVar3 = *(long *)(lVar3 + 0x50);
    *(double *)(lVar3 + 0x48) = *(double *)(lVar3 + 0x48) + move;
  }
  bVar8 = 0;
  for (uVar6 = 0; uVar6 < *(uint *)((long)&(peVar2->FakeFloor).Sectors.Count + uVar7);
      uVar6 = uVar6 + 1) {
    bVar5 = P_ChangeSector(*(sector_t_conflict **)
                            (*(long *)((long)&(peVar2->FakeFloor).Sectors.Array + uVar7) + uVar6 * 8
                            ),crush,move,2,true);
    bVar8 = bVar8 | bVar5;
  }
  return (bool)(~bVar8 & 1);
}

Assistant:

bool P_Scroll3dMidtex(sector_t *sector, int crush, double move, bool ceiling)
{
	extsector_t::midtex::plane &scrollplane = ceiling? sector->e->Midtex.Ceiling : sector->e->Midtex.Floor;

	// First step: Change all lines' texture offsets
	for(unsigned i = 0; i < scrollplane.AttachedLines.Size(); i++)
	{
		line_t *l = scrollplane.AttachedLines[i];

		l->sidedef[0]->AddTextureYOffset(side_t::mid, move);
		l->sidedef[1]->AddTextureYOffset(side_t::mid, move);
	}

	// Second step: Check all sectors whether the move is ok.
	bool res = false;

	for(unsigned i = 0; i < scrollplane.AttachedSectors.Size(); i++)
	{
		res |= P_ChangeSector(scrollplane.AttachedSectors[i], crush, move, 2, true);
	}
	return !res;
}